

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O1

int __thiscall
qclab::qgates::RotationX<std::complex<float>_>::toQASM
          (RotationX<std::complex<float>_> *this,ostream *stream,int offset)

{
  int iVar1;
  float fVar2;
  __string_type local_38;
  
  iVar1 = (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
          qubit_;
  fVar2 = atan2f((this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_,
                 (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_);
  qasm1<float>(&local_38,"rx",offset + iVar1,fVar2 + fVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmRx( this->qubit_ + offset , this->theta() ) ;
          return 0 ;
        }